

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffio.c
# Opt level: O0

void tidyBufFree(TidyBuffer *buf)

{
  TidyBuffer *buf_local;
  
  if (buf != (TidyBuffer *)0x0) {
    (*buf->allocator->vtbl->free)(buf->allocator,buf->bp);
    tidyBufInitWithAllocator(buf,buf->allocator);
    return;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/buffio.c"
                ,0x56,"void tidyBufFree(TidyBuffer *)");
}

Assistant:

void TIDY_CALL tidyBufFree( TidyBuffer* buf )
{
    assert( buf != NULL );
    TidyFree(  buf->allocator, buf->bp );
    tidyBufInitWithAllocator( buf, buf->allocator );
}